

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota.cc
# Opt level: O0

void * thread_routine(void *vparam)

{
  int iVar1;
  ssize_t sVar2;
  ssize_t max;
  size_t used;
  size_t total;
  size_t i;
  ssize_t allocated_size;
  size_t check_fail_count;
  thread_data *data;
  void *vparam_local;
  
  allocated_size = 0;
  i = 0;
  check_fail_count = (size_t)vparam;
  data = (thread_data *)vparam;
  for (total = 0; total < 0x20000; total = total + 1) {
    quota_get_total_and_used(&quota,&used,(size_t *)&max);
    if (used < (ulong)max) {
      allocated_size = allocated_size + 1;
    }
    iVar1 = rand();
    sVar2 = quota_set(&quota,(ulong)(long)iVar1 % 0x3fffffffc00);
    sched_yield();
    if (0 < sVar2) {
      *(ssize_t *)(check_fail_count + 8) = sVar2;
      *(long *)(check_fail_count + 0x18) = *(long *)(check_fail_count + 0x18) + 1;
    }
    if ((long)i < 1) {
      iVar1 = rand();
      i = (long)iVar1 % sVar2 + 1;
      i = quota_use(&quota,i);
      if (0 < (long)i) {
        *(size_t *)check_fail_count = i;
        *(long *)(check_fail_count + 0x10) = *(long *)(check_fail_count + 0x10) + 1;
      }
      sched_yield();
    }
    else {
      quota_release(&quota,i);
      i = 0xffffffffffffffff;
      *(undefined8 *)check_fail_count = 0;
      *(long *)(check_fail_count + 0x10) = *(long *)(check_fail_count + 0x10) + 1;
      sched_yield();
    }
  }
  return (void *)allocated_size;
}

Assistant:

void *thread_routine(void *vparam)
{
	struct thread_data *data = (struct thread_data *)vparam;
	size_t check_fail_count = 0;
	ssize_t allocated_size = 0;
	for (size_t i = 0; i < RUN_CNT; i++) {
		{
			size_t total, used;
			quota_get_total_and_used(&quota, &total, &used);
			if (used > total)
				check_fail_count++;
		}
		ssize_t max = rand() % QUOTA_MAX;
		max = quota_set(&quota, max);
		sched_yield();
		if (max > 0) {
			data->last_lim_set = max;
			data->lim_change_success++;
		}
		if (allocated_size > 0) {
			quota_release(&quota, allocated_size);
			allocated_size = -1;
			data->use_change = 0;
			data->use_change_success++;
			sched_yield();
		} else {
			allocated_size = rand() % max + 1;
			allocated_size = quota_use(&quota, allocated_size);
			if (allocated_size > 0) {
				data->use_change = allocated_size;
				data->use_change_success++;
			}
			sched_yield();
		}
	}
	return (void *)check_fail_count;
}